

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

PinState __thiscall HWISim::DigitalRead(HWISim *this,Pin pin)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  Pin local_14;
  HWISim *pHStack_10;
  Pin pin_local;
  HWISim *this_local;
  
  local_14 = pin;
  pHStack_10 = this;
  poVar1 = std::operator<<((ostream *)&std::cout,"DR ");
  pmVar2 = std::
           unordered_map<HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EnumHash,_std::equal_to<HWI::Pin>,_std::allocator<std::pair<const_HWI::Pin,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(&HWI::pinNames_abi_cxx11_,&local_14);
  poVar1 = std::operator<<(poVar1,(string *)pmVar2);
  std::operator<<(poVar1," returning HOME_INACTIVE");
  return HOME_INACTIVE;
}

Assistant:

PinState DigitalRead( Pin pin ) override
  {
    std::cout << "DR " << HWI::pinNames.at(pin) << " returning HOME_INACTIVE";
    return HWI::PinState::HOME_INACTIVE;
  }